

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::HashSetResizeHelper::
GrowIntoSingleGroupShuffleTransferableSlots
          (HashSetResizeHelper *this,void *new_slots,size_t slot_size)

{
  void *pvVar1;
  void *__src;
  size_t slot_size_local;
  void *new_slots_local;
  HashSetResizeHelper *this_local;
  
  if (this->old_capacity_ != 0) {
    pvVar1 = old_slots(this);
    SanitizerUnpoisonMemoryRegion(pvVar1,slot_size * this->old_capacity_);
    pvVar1 = SlotAddress(new_slots,1,slot_size);
    __src = old_slots(this);
    memcpy(pvVar1,__src,slot_size * this->old_capacity_);
    return;
  }
  __assert_fail("old_capacity_ > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                ,0x1ef,
                "void absl::container_internal::HashSetResizeHelper::GrowIntoSingleGroupShuffleTransferableSlots(void *, size_t) const"
               );
}

Assistant:

void HashSetResizeHelper::GrowIntoSingleGroupShuffleTransferableSlots(
    void* new_slots, size_t slot_size) const {
  ABSL_ASSUME(old_capacity_ > 0);
  SanitizerUnpoisonMemoryRegion(old_slots(), slot_size * old_capacity_);
  std::memcpy(SlotAddress(new_slots, 1, slot_size), old_slots(),
              slot_size * old_capacity_);
}